

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSet.cpp
# Opt level: O3

void __thiscall DataSet::toFile(DataSet *this,string *file_name)

{
  pointer pFVar1;
  runtime_error *this_00;
  pointer pFVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  size_t s;
  ofstream file;
  long local_238;
  long local_230;
  filebuf local_228 [24];
  int aiStack_210 [54];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,(string *)file_name,_S_bin);
  if (*(int *)((long)aiStack_210 + *(long *)(local_230 + -0x18)) == 0) {
    std::ostream::write((char *)&local_230,(long)this);
    local_238 = ((long)(this->vectors).super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->vectors).super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    std::ostream::write((char *)&local_230,(long)&local_238);
    pFVar1 = (this->vectors).super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>._M_impl.
             super__Vector_impl_data._M_start;
    pFVar2 = (this->vectors).super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pFVar2 != pFVar1) {
      uVar3 = this->num_features;
      uVar5 = 0;
      do {
        if (uVar3 == 0) {
          uVar3 = 0;
        }
        else {
          lVar4 = 0;
          uVar6 = 0;
          do {
            std::ostream::write((char *)&local_230,
                                *(long *)&(this->vectors).
                                          super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar5].values.
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl
                                + lVar4);
            uVar6 = uVar6 + 1;
            uVar3 = this->num_features;
            lVar4 = lVar4 + 4;
          } while (uVar6 < uVar3);
          pFVar1 = (this->vectors).super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pFVar2 = (this->vectors).super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < (ulong)(((long)pFVar2 - (long)pFVar1 >> 3) * -0x5555555555555555));
    }
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Could not write to file.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void DataSet::toFile(std::string file_name) {
  // Open the file
  std::ofstream file(file_name, std::ios::binary);

  if (file.good()) {
    // Write number of features
    file.write((char *) &num_features, sizeof(size_t));
    // Write size
    auto s = size();
    file.write((char *) &s, sizeof(size_t));

    // Write vectors
    for (size_t v = 0; v < size(); v++) {
      for (size_t f = 0; f < num_features; f++) {
        file.write((char *) &vector(v)[f], sizeof(float));
      }
    }
  } else {
    throw std::runtime_error("Could not write to file.");
  }
}